

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::ScrollArea::ensureWidgetVisible
          (ScrollArea *this,QWidget *childWidget,int xmargin,int ymargin)

{
  AbstractScrollAreaPrivate *pAVar1;
  char cVar2;
  undefined8 uVar3;
  QSize QVar4;
  long lVar5;
  AbstractScrollArea *pAVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QRect focusRect;
  QRect visibleRect;
  QPoint local_38;
  
  pAVar1 = (this->super_AbstractScrollArea).d.d;
  cVar2 = QWidget::isAncestorOf((QWidget *)pAVar1[1].q);
  if (cVar2 != '\0') {
    (**(code **)(*(long *)childWidget + 400))(&focusRect,childWidget,2);
    auVar9 = QVariant::toRect();
    QVariant::~QVariant((QVariant *)&focusRect);
    QWidget::inputMethodQuery((InputMethodQuery)&focusRect);
    auVar10 = QVariant::toRect();
    QVariant::~QVariant((QVariant *)&focusRect);
    if (((auVar10._8_4_ == auVar9._8_4_ && auVar10._0_4_ == auVar9._0_4_) &&
         (auVar10._0_8_ ^ auVar9._0_8_) >> 0x20 == 0) &&
       ((auVar10._8_8_ ^ auVar9._8_8_) >> 0x20 == 0)) {
      if ((pAVar1[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) ||
         (*(int *)((long)pAVar1[1]._vptr_AbstractScrollAreaPrivate + 4) == 0)) {
        pAVar6 = (AbstractScrollArea *)0x0;
      }
      else {
        pAVar6 = pAVar1[1].q;
      }
      local_38.xp = 0;
      local_38.yp = 0;
      uVar3 = QWidget::mapTo(childWidget,(QPoint *)pAVar6);
      QVar4 = QWidget::size(childWidget);
      focusRect.x1 = (int)uVar3;
      focusRect.x2 = focusRect.x1 + QVar4.wd + -1;
      focusRect.y1 = (int)((ulong)uVar3 >> 0x20);
      focusRect.y2 = QVar4.ht + focusRect.y1 + -1;
    }
    else {
      if ((pAVar1[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) ||
         (*(int *)((long)pAVar1[1]._vptr_AbstractScrollAreaPrivate + 4) == 0)) {
        pAVar6 = (AbstractScrollArea *)0x0;
      }
      else {
        pAVar6 = pAVar1[1].q;
      }
      visibleRect._0_8_ = auVar9._0_8_;
      uVar3 = QWidget::mapTo(childWidget,(QPoint *)pAVar6);
      focusRect.x1 = (int)uVar3;
      focusRect.x2 = (auVar9._8_4_ - auVar9._0_4_) + focusRect.x1;
      focusRect.y1 = (int)((ulong)uVar3 >> 0x20);
      focusRect.y2 = (auVar9._12_4_ - auVar9._4_4_) + focusRect.y1;
    }
    uVar3 = QWidget::pos();
    uVar8 = (uint)((ulong)uVar3 >> 0x20);
    QVar4 = QWidget::size(pAVar1->viewport);
    visibleRect.x2 = ~(uint)uVar3 + QVar4.wd;
    visibleRect.y2 = ~uVar8 + QVar4.ht;
    visibleRect.x1 = -(uint)uVar3;
    visibleRect.y1 = -uVar8;
    cVar2 = QRect::contains(&visibleRect,SUB81(&focusRect,0));
    if (cVar2 == '\0') {
      focusRect.x1 = focusRect.x1 - xmargin;
      focusRect.y1 = focusRect.y1 - ymargin;
      lVar5 = (long)focusRect.x2;
      focusRect.x2 = (int)(xmargin + lVar5);
      lVar7 = (long)focusRect.y2;
      focusRect.y2 = (int)(ymargin + lVar7);
      if ((visibleRect.x2 - visibleRect.x1) + 1 < (focusRect.x2 - focusRect.x1) + 1) {
        local_38.xp = ((*(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x1c) -
                       *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x14)) + 1) / -2 +
                      (int)((xmargin + lVar5 + (long)focusRect.x1) / 2);
      }
      else if (visibleRect.x2 < focusRect.x2) {
        local_38.xp = ~*(uint *)(*(long *)(pAVar1->viewport + 0x20) + 0x1c) + focusRect.x2 +
                      *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x14);
      }
      else {
        local_38.xp = 0;
        if (focusRect.x1 < visibleRect.x1) {
          local_38.xp = focusRect.x1;
        }
      }
      if ((visibleRect.y2 - visibleRect.y1) + 1 < (focusRect.y2 - focusRect.y1) + 1) {
        local_38.yp = ((*(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x20) -
                       *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x18)) + 1) / -2 +
                      (int)((ymargin + lVar7 + (long)focusRect.y1) / 2);
      }
      else if (visibleRect.y2 < focusRect.y2) {
        local_38.yp = ~*(uint *)(*(long *)(pAVar1->viewport + 0x20) + 0x20) + focusRect.y2 +
                      *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x18);
      }
      else {
        local_38.yp = 0;
        if (focusRect.y1 < visibleRect.y1) {
          local_38.yp = focusRect.y1;
        }
      }
      AbstractScrollArea::setTopLeftPointShownArea(&this->super_AbstractScrollArea,&local_38);
    }
  }
  return;
}

Assistant:

void
ScrollArea::ensureWidgetVisible( QWidget * childWidget,
	int xmargin, int ymargin )
{
	ScrollAreaPrivate * d = d_func();

	if( !d->widget->isAncestorOf( childWidget ) )
		return;

	const QRect microFocus =
		childWidget->inputMethodQuery( Qt::ImCursorRectangle ).toRect();
	const QRect defaultMicroFocus =
		childWidget->QWidget::inputMethodQuery( Qt::ImCursorRectangle ).toRect();
	QRect focusRect = ( microFocus != defaultMicroFocus )
		? QRect( childWidget->mapTo( d->widget, microFocus.topLeft() ), microFocus.size() )
		: QRect( childWidget->mapTo( d->widget, QPoint( 0,0 ) ), childWidget->size() );
	const QRect visibleRect( -d->widget->pos(), d->viewport->size() );

	if( visibleRect.contains( focusRect ) )
		return;

	focusRect.adjust( -xmargin, -ymargin, xmargin, ymargin );

	int posX = 0;
	int posY = 0;

	if( focusRect.width() > visibleRect.width() )
		posX = focusRect.center().x() - d->viewport->width() / 2;
	else if( focusRect.right() > visibleRect.right() )
		posX = focusRect.right() - d->viewport->width();
	else if( focusRect.left() < visibleRect.left() )
		posX = focusRect.left();

	if( focusRect.height() > visibleRect.height() )
		posY = focusRect.center().y() - d->viewport->height() / 2;
	else if( focusRect.bottom() > visibleRect.bottom() )
		posY = focusRect.bottom() - d->viewport->height();
	else if( focusRect.top() < visibleRect.top() )
		posY = focusRect.top();

	setTopLeftPointShownArea( QPoint( posX, posY ) );
}